

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder.c
# Opt level: O1

int av1_receive_compressed_data(AV1Decoder *pbi,size_t size,uint8_t **psource)

{
  byte bVar1;
  pthread_mutex_t *ppVar2;
  int *piVar3;
  bool bVar4;
  int iVar5;
  RefCntBuffer *pRVar6;
  AVxWorkerInterface *pAVar7;
  uint8_t *puVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  int *piVar12;
  ulong uVar13;
  long lVar14;
  RefCntBuffer **ppRVar15;
  aom_codec_frame_buffer_t *paVar16;
  AV1_COMMON *cm;
  
  puVar8 = *psource;
  (pbi->error).error_code = AOM_CODEC_OK;
  (pbi->error).has_detail = 0;
  if (size == 0) {
    lVar10 = (long)(pbi->common).remapped_ref_idx[0];
    if (lVar10 == -1) {
      pRVar6 = (RefCntBuffer *)0x0;
    }
    else {
      pRVar6 = (pbi->common).ref_frame_map[lVar10];
    }
    if (pRVar6 != (RefCntBuffer *)0x0) {
      (pRVar6->buf).corrupted = 1;
    }
  }
  pRVar6 = (pbi->common).cur_frame;
  if (pRVar6 != (RefCntBuffer *)0x0) {
    pRVar6->ref_count = pRVar6->ref_count + -1;
    (pbi->common).cur_frame = (RefCntBuffer *)0x0;
  }
  ppVar2 = (pthread_mutex_t *)(pbi->common).buffer_pool;
  piVar3 = *(int **)((long)ppVar2 + 0x40);
  pthread_mutex_lock(ppVar2);
  bVar1 = ((pbi->common).buffer_pool)->num_frame_bufs;
  if (bVar1 == 0) {
    uVar9 = 0;
  }
  else {
    uVar13 = 0;
    piVar12 = piVar3;
    do {
      if (*piVar12 == 0) {
        uVar9 = (uint)uVar13;
        goto LAB_0017ae9d;
      }
      uVar13 = uVar13 + 1;
      piVar12 = piVar12 + 0x1638;
    } while (bVar1 != uVar13);
    uVar9 = (uint)bVar1;
  }
LAB_0017ae9d:
  uVar11 = 0xffffffff;
  if (uVar9 != bVar1) {
    piVar12 = piVar3 + (ulong)uVar9 * 0x1638;
    if (piVar3[(ulong)uVar9 * 0x1638 + 0x148] != 0) {
      *(undefined8 *)(piVar12 + 0x142) = *(undefined8 *)(piVar12 + 0x14a);
      *(undefined8 *)(piVar12 + 0x144) = *(undefined8 *)(piVar12 + 0x14c);
      *(undefined8 *)(piVar12 + 0x146) = *(undefined8 *)(piVar12 + 0x14e);
      piVar12[0x148] = 0;
    }
    *piVar12 = 1;
    uVar11 = uVar9;
  }
  pthread_mutex_unlock((pthread_mutex_t *)(pbi->common).buffer_pool);
  if (uVar11 == 0xffffffff) {
LAB_0017afdb:
    (pbi->error).error_code = AOM_CODEC_MEM_ERROR;
    return 1;
  }
  pRVar6 = ((pbi->common).buffer_pool)->frame_bufs;
  (pbi->common).cur_frame = pRVar6 + (int)uVar11;
  aom_invalidate_pyramid(pRVar6[(int)uVar11].buf.y_pyramid);
  av1_invalidate_corner_list((((pbi->common).cur_frame)->buf).corners);
  pRVar6 = (pbi->common).cur_frame;
  pRVar6->interp_filter_selected[0] = 0;
  pRVar6->interp_filter_selected[1] = 0;
  pRVar6->interp_filter_selected[2] = 0;
  pRVar6->interp_filter_selected[3] = 0;
  if ((pbi->common).cur_frame == (RefCntBuffer *)0x0) goto LAB_0017afdb;
  iVar5 = _setjmp((__jmp_buf_tag *)(pbi->error).jmp);
  if (iVar5 != 0) {
    pAVar7 = aom_get_worker_interface();
    (pbi->error).setjmp = 0;
    (*pAVar7->sync)(&pbi->lf_worker);
    if (0 < pbi->num_workers) {
      lVar14 = 0;
      lVar10 = lVar14;
      do {
        (*pAVar7->sync)((AVxWorker *)((long)&pbi->tile_workers->impl_ + lVar14));
        lVar10 = lVar10 + 1;
        lVar14 = lVar14 + 0x38;
      } while (lVar10 < pbi->num_workers);
    }
    release_current_frame(pbi);
    return -1;
  }
  (pbi->error).setjmp = 1;
  iVar5 = aom_decode_frame_from_obus(pbi,puVar8,puVar8 + size,psource);
  if (iVar5 < 0) {
    release_current_frame(pbi);
    goto LAB_0017b24c;
  }
  ppVar2 = (pthread_mutex_t *)(pbi->common).buffer_pool;
  pthread_mutex_lock(ppVar2);
  if (iVar5 == 0) {
LAB_0017b149:
    pRVar6 = (pbi->common).cur_frame;
    if ((pRVar6 != (RefCntBuffer *)0x0) &&
       ((pRVar6->ref_count = pRVar6->ref_count + -1, pRVar6->ref_count == 0 &&
        ((pRVar6->raw_frame_buffer).data != (uint8_t *)0x0)))) {
      paVar16 = &pRVar6->raw_frame_buffer;
      (**(code **)((long)ppVar2 + 0x38))(ppVar2[1].__align,paVar16);
      paVar16->data = (uint8_t *)0x0;
      paVar16->size = 0;
      (pRVar6->raw_frame_buffer).priv = (void *)0x0;
    }
  }
  else {
    if ((pbi->camera_frame_header_ready == 0) &&
       (uVar9 = (pbi->common).current_frame.refresh_frame_flags, uVar9 != 0)) {
      ppRVar15 = (pbi->common).ref_frame_map;
      do {
        if ((uVar9 & 1) != 0) {
          pRVar6 = *ppRVar15;
          if (((pRVar6 != (RefCntBuffer *)0x0) &&
              (pRVar6->ref_count = pRVar6->ref_count + -1, pRVar6->ref_count == 0)) &&
             ((pRVar6->raw_frame_buffer).data != (uint8_t *)0x0)) {
            paVar16 = &pRVar6->raw_frame_buffer;
            (**(code **)((long)ppVar2 + 0x38))(ppVar2[1].__align,paVar16);
            paVar16->data = (uint8_t *)0x0;
            paVar16->size = 0;
            (pRVar6->raw_frame_buffer).priv = (void *)0x0;
          }
          pRVar6 = (pbi->common).cur_frame;
          *ppRVar15 = pRVar6;
          pRVar6->ref_count = pRVar6->ref_count + 1;
        }
        ppRVar15 = ppRVar15 + 1;
        bVar4 = 1 < uVar9;
        uVar9 = (int)uVar9 >> 1;
      } while (bVar4);
    }
    if (((pbi->common).show_existing_frame == 0) && ((pbi->common).show_frame == 0))
    goto LAB_0017b149;
    uVar13 = pbi->num_output_frames;
    if (pbi->output_all_layers == 0) {
      if ((((uVar13 != 0) && (pRVar6 = pbi->output_frames[0], pRVar6 != (RefCntBuffer *)0x0)) &&
          (pRVar6->ref_count = pRVar6->ref_count + -1, pRVar6->ref_count == 0)) &&
         ((pRVar6->raw_frame_buffer).data != (uint8_t *)0x0)) {
        paVar16 = &pRVar6->raw_frame_buffer;
        (**(code **)((long)ppVar2 + 0x38))(ppVar2[1].__align,paVar16);
        paVar16->data = (uint8_t *)0x0;
        paVar16->size = 0;
        (pRVar6->raw_frame_buffer).priv = (void *)0x0;
      }
      pbi->output_frames[0] = (pbi->common).cur_frame;
      pbi->num_output_frames = 1;
    }
    else {
      pRVar6 = (pbi->common).cur_frame;
      if (uVar13 < 4) {
        pbi->output_frames[uVar13] = pRVar6;
        pbi->num_output_frames = uVar13 + 1;
      }
      else {
        (pRVar6->buf).corrupted = 1;
        if (((pRVar6 != (RefCntBuffer *)0x0) &&
            (pRVar6->ref_count = pRVar6->ref_count + -1, pRVar6->ref_count == 0)) &&
           ((pRVar6->raw_frame_buffer).data != (uint8_t *)0x0)) {
          paVar16 = &pRVar6->raw_frame_buffer;
          (**(code **)((long)ppVar2 + 0x38))(ppVar2[1].__align,paVar16);
          paVar16->data = (uint8_t *)0x0;
          paVar16->size = 0;
          (pRVar6->raw_frame_buffer).priv = (void *)0x0;
        }
        (pbi->error).error_code = AOM_CODEC_UNSUP_BITSTREAM;
      }
    }
  }
  pthread_mutex_unlock(ppVar2);
  (pbi->common).cur_frame = (RefCntBuffer *)0x0;
  if (pbi->camera_frame_header_ready == 0) {
    (pbi->common).remapped_ref_idx[3] = -1;
    (pbi->common).remapped_ref_idx[4] = -1;
    (pbi->common).remapped_ref_idx[5] = -1;
    (pbi->common).remapped_ref_idx[6] = -1;
    (pbi->common).remapped_ref_idx[0] = -1;
    (pbi->common).remapped_ref_idx[1] = -1;
    (pbi->common).remapped_ref_idx[2] = -1;
    (pbi->common).remapped_ref_idx[3] = -1;
  }
  if (iVar5 != 0) {
    pbi->decoding_first_frame = 0;
  }
  if ((pbi->error).error_code == AOM_CODEC_OK) {
    if (((pbi->common).show_existing_frame == 0) && ((pbi->common).seg.enabled != '\0')) {
      if (((pbi->common).prev_frame == (RefCntBuffer *)0x0) ||
         (((pbi->common).mi_params.mi_rows != ((pbi->common).prev_frame)->mi_rows ||
          ((pbi->common).mi_params.mi_cols != ((pbi->common).prev_frame)->mi_cols)))) {
        puVar8 = (uint8_t *)0x0;
      }
      else {
        puVar8 = ((pbi->common).prev_frame)->seg_map;
      }
      (pbi->common).last_frame_seg_map = puVar8;
    }
    (pbi->error).setjmp = 0;
    return 0;
  }
LAB_0017b24c:
  (pbi->error).setjmp = 0;
  return 1;
}

Assistant:

int av1_receive_compressed_data(AV1Decoder *pbi, size_t size,
                                const uint8_t **psource) {
  AV1_COMMON *volatile const cm = &pbi->common;
  const uint8_t *source = *psource;
  pbi->error.error_code = AOM_CODEC_OK;
  pbi->error.has_detail = 0;

  if (size == 0) {
    // This is used to signal that we are missing frames.
    // We do not know if the missing frame(s) was supposed to update
    // any of the reference buffers, but we act conservative and
    // mark only the last buffer as corrupted.
    //
    // TODO(jkoleszar): Error concealment is undefined and non-normative
    // at this point, but if it becomes so, [0] may not always be the correct
    // thing to do here.
    RefCntBuffer *ref_buf = get_ref_frame_buf(cm, LAST_FRAME);
    if (ref_buf != NULL) ref_buf->buf.corrupted = 1;
  }

  if (assign_cur_frame_new_fb(cm) == NULL) {
    pbi->error.error_code = AOM_CODEC_MEM_ERROR;
    return 1;
  }

  // The jmp_buf is valid only for the duration of the function that calls
  // setjmp(). Therefore, this function must reset the 'setjmp' field to 0
  // before it returns.
  if (setjmp(pbi->error.jmp)) {
    const AVxWorkerInterface *const winterface = aom_get_worker_interface();
    int i;

    pbi->error.setjmp = 0;

    // Synchronize all threads immediately as a subsequent decode call may
    // cause a resize invalidating some allocations.
    winterface->sync(&pbi->lf_worker);
    for (i = 0; i < pbi->num_workers; ++i) {
      winterface->sync(&pbi->tile_workers[i]);
    }

    release_current_frame(pbi);
    return -1;
  }

  pbi->error.setjmp = 1;

  int frame_decoded =
      aom_decode_frame_from_obus(pbi, source, source + size, psource);

  if (frame_decoded < 0) {
    assert(pbi->error.error_code != AOM_CODEC_OK);
    release_current_frame(pbi);
    pbi->error.setjmp = 0;
    return 1;
  }

#if TXCOEFF_TIMER
  cm->cum_txcoeff_timer += cm->txcoeff_timer;
  fprintf(stderr,
          "txb coeff block number: %d, frame time: %ld, cum time %ld in us\n",
          cm->txb_count, cm->txcoeff_timer, cm->cum_txcoeff_timer);
  cm->txcoeff_timer = 0;
  cm->txb_count = 0;
#endif

  // Note: At this point, this function holds a reference to cm->cur_frame
  // in the buffer pool. This reference is consumed by update_frame_buffers().
  update_frame_buffers(pbi, frame_decoded);

  if (frame_decoded) {
    pbi->decoding_first_frame = 0;
  }

  if (pbi->error.error_code != AOM_CODEC_OK) {
    pbi->error.setjmp = 0;
    return 1;
  }

  if (!cm->show_existing_frame) {
    if (cm->seg.enabled) {
      if (cm->prev_frame &&
          (cm->mi_params.mi_rows == cm->prev_frame->mi_rows) &&
          (cm->mi_params.mi_cols == cm->prev_frame->mi_cols)) {
        cm->last_frame_seg_map = cm->prev_frame->seg_map;
      } else {
        cm->last_frame_seg_map = NULL;
      }
    }
  }

  // Update progress in frame parallel decode.
  pbi->error.setjmp = 0;

  return 0;
}